

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O2

bool __thiscall FIX::SocketConnection::isValidSession(SocketConnection *this)

{
  bool bVar1;
  iterator iVar2;
  SessionID sessionID;
  SessionID local_160;
  
  if (this->m_pSession == (Session *)0x0) {
    bVar1 = false;
  }
  else {
    SessionID::SessionID(&local_160,&this->m_pSession->m_sessionID);
    bVar1 = Session::isSessionRegistered(&local_160);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      iVar2 = std::
              _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
              ::find(&(this->m_sessions)._M_t,&local_160);
      bVar1 = (_Rb_tree_header *)iVar2._M_node !=
              &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
    }
    SessionID::~SessionID(&local_160);
  }
  return bVar1;
}

Assistant:

bool SocketConnection::isValidSession() {
  if (m_pSession == 0) {
    return false;
  }
  SessionID sessionID = m_pSession->getSessionID();
  if (Session::isSessionRegistered(sessionID)) {
    return false;
  }
  return !(m_sessions.find(sessionID) == m_sessions.end());
}